

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

void CorUnix::PALCS_DumpCSList(void)

{
  undefined *puVar1;
  CPalThread *pThread;
  PCRITICAL_SECTION_DEBUG_INFO pDebugInfo;
  undefined **ppuVar2;
  
  pThread = InternalGetCurrentThread();
  InternalEnterCriticalSection(pThread,(PCRITICAL_SECTION)&g_csPALCSsListLock);
  ppuVar2 = &g_PALCSList;
  while (ppuVar2 = (undefined **)*ppuVar2, ppuVar2 != &g_PALCSList) {
    puVar1 = ppuVar2[2];
    printf("CS @ %p \n{\tDebugInfo = %p -> \n",puVar1,ppuVar2);
    printf("\t{\n\t\t[Link]\n\t\tpOwnerCS = %p\n\t\tAcquireCount \t= %d\n\t\tEnterCount \t= %d\n\t\tContentionCount = %d\n"
           ,ppuVar2[2],(ulong)*(uint *)(ppuVar2 + 3),(ulong)*(uint *)((long)ppuVar2 + 0x1c),
           (ulong)*(uint *)(ppuVar2 + 4));
    printf("\t}\n");
    printf("\tLockCount \t= %#x\n\tRecursionCount \t= %d\n\tOwningThread \t= %p\n\tLockSemaphore \t= %p\n\tSpinCount \t= %u\n\tfInternal \t= %d\n\teInitState \t= %u\n\tpNativeData \t= %p ->\n"
           ,(ulong)*(uint *)(puVar1 + 8),(ulong)*(uint *)(puVar1 + 0xc),
           *(undefined8 *)(puVar1 + 0x10),*(undefined8 *)(puVar1 + 0x18),
           (ulong)*(uint *)(puVar1 + 0x20),(ulong)*(uint *)(puVar1 + 0x28),
           (ulong)*(uint *)(puVar1 + 0x2c),puVar1 + 0x30);
    printf("\t{\n\t\t[mutex]\n\t\t[condition]\n\t\tPredicate \t= %d\n\t}\n}\n",
           (ulong)*(uint *)(puVar1 + 0x88));
    printf("}\n");
  }
  InternalLeaveCriticalSection(pThread,(PCRITICAL_SECTION)&g_csPALCSsListLock);
  return;
}

Assistant:

void PALCS_DumpCSList()
    {
        CPalThread * pThread = InternalGetCurrentThread();

        // Take the lock for the global list of CS debug infos
        InternalEnterCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);

        PLIST_ENTRY pItem = g_PALCSList.Flink;
        while (&g_PALCSList != pItem)
        {
            PCRITICAL_SECTION_DEBUG_INFO pDebugInfo =
                (PCRITICAL_SECTION_DEBUG_INFO)pItem;
            PPAL_CRITICAL_SECTION pCS = pDebugInfo->pOwnerCS;

            printf("CS @ %p \n"
                   "{\tDebugInfo = %p -> \n",
                   pCS, pDebugInfo);

            printf("\t{\n\t\t[Link]\n\t\tpOwnerCS = %p\n"
                   "\t\tAcquireCount \t= %d\n"
                   "\t\tEnterCount \t= %d\n"
                   "\t\tContentionCount = %d\n",
                   pDebugInfo->pOwnerCS, pDebugInfo->lAcquireCount.Load(),
                   pDebugInfo->lEnterCount.Load(), pDebugInfo->lContentionCount.Load());
            printf("\t}\n");

            printf("\tLockCount \t= %#x\n"
                   "\tRecursionCount \t= %d\n"
                   "\tOwningThread \t= %p\n"
                   "\tLockSemaphore \t= %p\n"
                   "\tSpinCount \t= %u\n"
                   "\tfInternal \t= %d\n"
                   "\teInitState \t= %u\n"
                   "\tpNativeData \t= %p ->\n",
                   pCS->LockCount.Load(), pCS->RecursionCount, (void *)pCS->OwningThread,
                   pCS->LockSemaphore, (unsigned)pCS->SpinCount, (int)pCS->fInternal,
                   pCS->cisInitState.Load(), &pCS->csndNativeData);

            printf("\t{\n\t\t[mutex]\n\t\t[condition]\n"
                   "\t\tPredicate \t= %d\n"
                   "\t}\n}\n",pCS->csndNativeData.iPredicate);

            printf("}\n");

            pItem = pItem->Flink;
        }

        // Release the lock for the global list of CS debug infos
        InternalLeaveCriticalSection(pThread, (CRITICAL_SECTION*)&g_csPALCSsListLock);
    }